

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

Cba_Man_t * Cba_ManReadVerilog(char *pFileName)

{
  Vec_Ptr_t *vDes;
  Cba_Man_t *pCVar1;
  
  vDes = Prs_ManReadVerilog(pFileName);
  if ((vDes == (Vec_Ptr_t *)0x0) || (vDes->nSize == 0)) {
    pCVar1 = (Cba_Man_t *)0x0;
  }
  else {
    pCVar1 = Prs_ManBuildCbaVerilog(pFileName,vDes);
  }
  if (vDes != (Vec_Ptr_t *)0x0) {
    Prs_ManVecFree(vDes);
  }
  return pCVar1;
}

Assistant:

Cba_Man_t * Cba_ManReadVerilog( char * pFileName )
{
    Cba_Man_t * p = NULL;
    Vec_Ptr_t * vDes = Prs_ManReadVerilog( pFileName );
    if ( vDes && Vec_PtrSize(vDes) )
        p = Prs_ManBuildCbaVerilog( pFileName, vDes );
    if ( vDes )
        Prs_ManVecFree( vDes );
    return p;
}